

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

int cuddGarbageCollect(DdManager *unique,int clearCache)

{
  uint *puVar1;
  int *piVar2;
  DdCache *pDVar3;
  ulong uVar4;
  ulong uVar5;
  DdManager *pDVar6;
  DdNode *pDVar7;
  DdManager *pDVar8;
  int iVar9;
  abctime aVar10;
  abctime aVar11;
  long lVar12;
  DdNode *pDVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *caller;
  DdNode *pDVar14;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  uint uVar15;
  uint uVar16;
  long lVar17;
  DdSubtable *pDVar18;
  DdNode **ppDVar19;
  long lVar20;
  DdNode **ppDVar21;
  uint uVar22;
  DdHook *pDVar23;
  bool bVar24;
  
  pDVar3 = unique->cache;
  cuddClearDeathRow(unique);
  for (pDVar23 = unique->preGCHook; pDVar23 != (DdHook *)0x0; pDVar23 = pDVar23->next) {
    iVar9 = (*pDVar23->f)(unique,"DD",(void *)0x0);
    if (iVar9 == 0) {
      return 0;
    }
  }
  if (unique->dead + unique->deadZ == 0) {
    pDVar23 = unique->postGCHook;
    if (pDVar23 == (DdHook *)0x0) {
      return 0;
    }
    do {
      iVar9 = (*pDVar23->f)(unique,"DD",(void *)0x0);
      if (iVar9 == 0) {
        return 0;
      }
      pDVar23 = pDVar23->next;
    } while (pDVar23 != (DdHook *)0x0);
    return 0;
  }
  if ((((clearCache != 0) && (unique->gcFrac == 1.0)) && (!NAN(unique->gcFrac))) &&
     ((unique->slots <= unique->looseUpTo && (unique->stash != (char *)0x0)))) {
    unique->minDead = unique->slots << 2;
    unique->gcFrac = 4.0;
    return 0;
  }
  uVar22 = 0;
  aVar10 = Extra_CpuTime();
  unique->garbageCollections = unique->garbageCollections + 1;
  caller = extraout_RDX;
  if (clearCache != 0) {
    uVar15 = unique->cacheSlots;
    if (0 < (long)(int)uVar15) {
      lVar12 = 0;
      do {
        uVar4 = *(ulong *)((long)&pDVar3->data + lVar12);
        if ((uVar4 != 0) &&
           ((((uVar5 = *(ulong *)((long)&pDVar3->f + lVar12),
              *(int *)((uVar5 & 0xfffffffffffffff0) + 4) == 0 ||
              (*(int *)((*(ulong *)((long)&pDVar3->g + lVar12) & 0xfffffffffffffff0) + 4) == 0)) ||
             (((uVar5 & 2) != 0 &&
              (*(int *)((*(ulong *)((long)&pDVar3->h + lVar12) & 0xfffffffffffffffe) + 4) == 0))))
            || ((uVar4 != 1 && (*(int *)((uVar4 & 0xfffffffffffffffe) + 4) == 0)))))) {
          *(undefined8 *)((long)&pDVar3->data + lVar12) = 0;
          unique->cachedeletions = unique->cachedeletions + 1.0;
        }
        lVar12 = lVar12 + 0x28;
      } while ((long)(int)uVar15 * 0x28 != lVar12);
    }
    cuddLocalCacheClearDead(unique);
    caller = extraout_RDX_00;
  }
  iVar9 = unique->size;
  if (0 < (long)iVar9) {
    pDVar18 = unique->subtables;
    lVar12 = 0;
    uVar22 = 0;
    do {
      if (pDVar18[lVar12].dead != 0) {
        lVar17 = (long)(int)pDVar18[lVar12].slots;
        if (lVar17 < 1) {
          caller = (char *)0x0;
        }
        else {
          ppDVar19 = pDVar18[lVar12].nodelist;
          lVar20 = 0;
          caller = (char *)0x0;
          do {
            ppDVar21 = ppDVar19 + lVar20;
            pDVar8 = (DdManager *)*ppDVar21;
            while (pDVar8 != unique) {
              pDVar6 = (DdManager *)(pDVar8->sentinel).next;
              if ((pDVar8->sentinel).ref == 0) {
                caller = (char *)(ulong)((int)caller + 1);
                pDVar8 = pDVar6;
              }
              else {
                *ppDVar21 = &pDVar8->sentinel;
                ppDVar21 = &(pDVar8->sentinel).next;
                pDVar8 = pDVar6;
              }
            }
            *ppDVar21 = &unique->sentinel;
            lVar20 = lVar20 + 1;
          } while (lVar20 != lVar17);
          pDVar18 = unique->subtables;
        }
        uVar15 = (uint)caller;
        if (uVar15 != pDVar18[lVar12].dead) goto LAB_0080f168;
        uVar22 = uVar22 + uVar15;
        pDVar18[lVar12].keys = pDVar18[lVar12].keys - uVar15;
        pDVar18[lVar12].dead = 0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar9);
  }
  uVar15 = (unique->constants).dead;
  if (uVar15 != 0) {
    lVar12 = (long)(int)(unique->constants).slots;
    if (lVar12 < 1) {
      caller = (char *)0x0;
    }
    else {
      ppDVar19 = (unique->constants).nodelist;
      lVar17 = 0;
      caller = (char *)0x0;
      do {
        ppDVar21 = ppDVar19 + lVar17;
        pDVar13 = *ppDVar21;
        while (pDVar13 != (DdNode *)0x0) {
          pDVar14 = pDVar13->next;
          if (pDVar13->ref == 0) {
            caller = (char *)(ulong)((int)caller + 1);
            pDVar13 = pDVar14;
          }
          else {
            *ppDVar21 = pDVar13;
            ppDVar21 = &pDVar13->next;
            pDVar13 = pDVar14;
          }
        }
        *ppDVar21 = (DdNode *)0x0;
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar12);
    }
    if ((uint)caller != uVar15) goto LAB_0080f17d;
    uVar22 = uVar22 + uVar15;
    puVar1 = &(unique->constants).keys;
    *puVar1 = *puVar1 - uVar15;
    (unique->constants).dead = 0;
  }
  if (uVar22 == unique->dead) {
    unique->keys = unique->keys - uVar22;
    unique->dead = 0;
    iVar9 = unique->sizeZ;
    if ((long)iVar9 < 1) {
      uVar15 = 0;
    }
    else {
      pDVar18 = unique->subtableZ;
      lVar12 = 0;
      uVar15 = 0;
      do {
        if (pDVar18[lVar12].dead != 0) {
          lVar17 = (long)(int)pDVar18[lVar12].slots;
          if (lVar17 < 1) {
            caller = (char *)0x0;
          }
          else {
            ppDVar19 = pDVar18[lVar12].nodelist;
            lVar20 = 0;
            caller = (char *)0x0;
            do {
              ppDVar21 = ppDVar19 + lVar20;
              pDVar13 = *ppDVar21;
              while (pDVar13 != (DdNode *)0x0) {
                pDVar14 = pDVar13->next;
                if (pDVar13->ref == 0) {
                  caller = (char *)(ulong)((int)caller + 1);
                  pDVar13 = pDVar14;
                }
                else {
                  *ppDVar21 = pDVar13;
                  ppDVar21 = &pDVar13->next;
                  pDVar13 = pDVar14;
                }
              }
              *ppDVar21 = (DdNode *)0x0;
              lVar20 = lVar20 + 1;
            } while (lVar20 != lVar17);
            pDVar18 = unique->subtableZ;
          }
          uVar16 = (uint)caller;
          if (uVar16 != pDVar18[lVar12].dead) goto LAB_0080f168;
          uVar15 = uVar15 + uVar16;
          pDVar18[lVar12].keys = pDVar18[lVar12].keys - uVar16;
          pDVar18[lVar12].dead = 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar9);
    }
    if (uVar15 == unique->deadZ) {
      unique->keysZ = unique->keysZ - uVar15;
      unique->deadZ = 0;
      pDVar13 = (DdNode *)0x0;
      pDVar14 = (DdNode *)unique->memoryList;
      do {
        uVar16 = 0x20 - ((uint)pDVar14 & 0x1f) & 0xfffffff8;
        pDVar7 = *(DdNode **)pDVar14;
        lVar12 = 0;
        do {
          if (*(int *)((long)&pDVar14->ref + lVar12 + (ulong)uVar16) == 0) {
            ppDVar19 = &pDVar13->next;
            bVar24 = pDVar13 == (DdNode *)0x0;
            pDVar13 = (DdNode *)((long)&pDVar14->index + lVar12 + (ulong)uVar16);
            if (bVar24) {
              ppDVar19 = &unique->nextFree;
            }
            *ppDVar19 = pDVar13;
          }
          lVar12 = lVar12 + 0x28;
        } while (lVar12 != 0x9fb0);
        pDVar14 = pDVar7;
      } while (pDVar7 != (DdNode *)0x0);
      pDVar13->next = (DdNode *)0x0;
      aVar11 = Extra_CpuTime();
      unique->GCTime = unique->GCTime + (aVar11 - aVar10);
      pDVar23 = unique->postGCHook;
      while( true ) {
        if (pDVar23 == (DdHook *)0x0) {
          return uVar15 + uVar22;
        }
        iVar9 = (*pDVar23->f)(unique,"DD",(void *)0x0);
        if (iVar9 == 0) break;
        pDVar23 = pDVar23->next;
      }
      return 0;
    }
  }
LAB_0080f170:
  ddReportRefMess(unique,-1,caller);
  caller = extraout_RDX_02;
LAB_0080f17d:
  ddReportRefMess(unique,0x7fffffff,caller);
  unique->maxCacheHard = unique->cacheSlots - 1;
  unique->cacheSlack = ~unique->cacheSlots;
  iVar9 = unique->size;
  if (0 < (long)iVar9) {
    pDVar18 = unique->subtables;
    lVar12 = 0;
    do {
      piVar2 = (int *)((long)&pDVar18->maxKeys + lVar12);
      *piVar2 = *piVar2 << 2;
      lVar12 = lVar12 + 0x38;
    } while ((long)iVar9 * 0x38 - lVar12 != 0);
  }
  unique->gcFrac = 0.2;
  unique->minDead = (uint)(long)((double)unique->slots * 0.2);
  cuddShrinkDeathRow(unique);
  fwrite("Slowing down table growth: ",0x1b,1,(FILE *)unique->err);
  fprintf((FILE *)unique->err,"GC fraction = %.2f\t",unique->gcFrac);
  iVar9 = fprintf((FILE *)unique->err,"minDead = %u\n",(ulong)unique->minDead);
  return iVar9;
LAB_0080f168:
  ddReportRefMess(unique,(int)lVar12,caller);
  caller = extraout_RDX_01;
  goto LAB_0080f170;
}

Assistant:

int
cuddGarbageCollect(
  DdManager * unique,
  int  clearCache)
{
    DdHook      *hook;
    DdCache     *cache = unique->cache;
    DdNode      *sentinel = &(unique->sentinel);
    DdNodePtr   *nodelist;
    int         i, j, deleted, totalDeleted, totalDeletedZ;
    DdCache     *c;
    DdNode      *node,*next;
    DdNodePtr   *lastP;
    int         slots;
    long        localTime;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    DdNodePtr   tree;
#else
    DdNodePtr *memListTrav, *nxtNode;
    DdNode *downTrav, *sentry;
    int k;
#endif
#endif

#ifndef DD_NO_DEATH_ROW
    cuddClearDeathRow(unique);
#endif

    hook = unique->preGCHook;
    while (hook != NULL) {
        int res = (hook->f)(unique,"DD",NULL);
        if (res == 0) return(0);
        hook = hook->next;
    }

    if (unique->dead + unique->deadZ == 0) {
        hook = unique->postGCHook;
        while (hook != NULL) {
            int res = (hook->f)(unique,"DD",NULL);
            if (res == 0) return(0);
            hook = hook->next;
        }
        return(0);
    }

    /* If many nodes are being reclaimed, we want to resize the tables
    ** more aggressively, to reduce the frequency of garbage collection.
    */
    if (clearCache && unique->gcFrac == DD_GC_FRAC_LO &&
        unique->slots <= unique->looseUpTo && unique->stash != NULL) {
        unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_HI);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        unique->gcFrac = DD_GC_FRAC_HI;
        return(0);
    }

    localTime = util_cpu_time();

    unique->garbageCollections++;
#ifdef DD_VERBOSE
    (void) fprintf(unique->err,
                   "garbage collecting (%d dead BDD nodes out of %d, min %d)...",
                   unique->dead, unique->keys, unique->minDead);
    (void) fprintf(unique->err,
                   "                   (%d dead ZDD nodes out of %d)...",
                   unique->deadZ, unique->keysZ);
#endif

    /* Remove references to garbage collected nodes from the cache. */
    if (clearCache) {
        slots = unique->cacheSlots;
        for (i = 0; i < slots; i++) {
            c = &cache[i];
            if (c->data != NULL) {
                if (cuddClean(c->f)->ref == 0 ||
                cuddClean(c->g)->ref == 0 ||
                (((ptruint)c->f & 0x2) && Cudd_Regular(c->h)->ref == 0) ||
                (c->data != DD_NON_CONSTANT &&
                Cudd_Regular(c->data)->ref == 0)) {
                    c->data = NULL;
                    unique->cachedeletions++;
                }
            }
        }
        cuddLocalCacheClearDead(unique);
    }

    /* Now return dead nodes to free list. Count them for sanity check. */
    totalDeleted = 0;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    tree = NULL;
#endif
#endif

    for (i = 0; i < unique->size; i++) {
        if (unique->subtables[i].dead == 0) continue;
        nodelist = unique->subtables[i].nodelist;

        deleted = 0;
        slots = unique->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != sentinel) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = sentinel;
        }
        if ((unsigned) deleted != unique->subtables[i].dead) {
            ddReportRefMess(unique, i, "cuddGarbageCollect");
        }
        totalDeleted += deleted;
        unique->subtables[i].keys -= deleted;
        unique->subtables[i].dead = 0;
    }
    if (unique->constants.dead != 0) {
        nodelist = unique->constants.nodelist;
        deleted = 0;
        slots = unique->constants.slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != NULL) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = NULL;
        }
        if ((unsigned) deleted != unique->constants.dead) {
            ddReportRefMess(unique, CUDD_CONST_INDEX, "cuddGarbageCollect");
        }
        totalDeleted += deleted;
        unique->constants.keys -= deleted;
        unique->constants.dead = 0;
    }
    if ((unsigned) totalDeleted != unique->dead) {
        ddReportRefMess(unique, -1, "cuddGarbageCollect");
    }
    unique->keys -= totalDeleted;
    unique->dead = 0;
#ifdef DD_STATS
    unique->nodesFreed += (double) totalDeleted;
#endif

    totalDeletedZ = 0;

    for (i = 0; i < unique->sizeZ; i++) {
        if (unique->subtableZ[i].dead == 0) continue;
        nodelist = unique->subtableZ[i].nodelist;

        deleted = 0;
        slots = unique->subtableZ[i].slots;
        for (j = 0; j < slots; j++) {
            lastP = &(nodelist[j]);
            node = *lastP;
            while (node != NULL) {
                next = node->next;
                if (node->ref == 0) {
                    deleted++;
#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                    cuddOrderedInsert(&tree,node);
#ifdef __osf__
#pragma pointer_size restore
#endif
#endif
#else
                    cuddDeallocNode(unique,node);
#endif
                } else {
                    *lastP = node;
                    lastP = &(node->next);
                }
                node = next;
            }
            *lastP = NULL;
        }
        if ((unsigned) deleted != unique->subtableZ[i].dead) {
            ddReportRefMess(unique, i, "cuddGarbageCollect");
        }
        totalDeletedZ += deleted;
        unique->subtableZ[i].keys -= deleted;
        unique->subtableZ[i].dead = 0;
    }

    /* No need to examine the constant table for ZDDs.
    ** If we did we should be careful not to count whatever dead
    ** nodes we found there among the dead ZDD nodes. */
    if ((unsigned) totalDeletedZ != unique->deadZ) {
        ddReportRefMess(unique, -1, "cuddGarbageCollect");
    }
    unique->keysZ -= totalDeletedZ;
    unique->deadZ = 0;
#ifdef DD_STATS
    unique->nodesFreed += (double) totalDeletedZ;
#endif


#ifndef DD_UNSORTED_FREE_LIST
#ifdef DD_RED_BLACK_FREE_LIST
    unique->nextFree = cuddOrderedThread(tree,unique->nextFree);
#else
    memListTrav = unique->memoryList;
    sentry = NULL;
    while (memListTrav != NULL) {
        ptruint offset;
        nxtNode = (DdNodePtr *)memListTrav[0];
//        offset = (ptruint) memListTrav & (sizeof(DdNode) - 1);
//        memListTrav += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
        offset = (ptruint) memListTrav & (32 - 1);
        memListTrav += (32 - offset) / sizeof(DdNodePtr);

        downTrav = (DdNode *)memListTrav;
        k = 0;
        do {
            if (downTrav[k].ref == 0) {
                if (sentry == NULL) {
                    unique->nextFree = sentry = &downTrav[k];
                } else {
                    /* First hook sentry->next to the dead node and then
                    ** reassign sentry to the dead node. */
                    sentry = (sentry->next = &downTrav[k]);
                }
            }
        } while (++k < DD_MEM_CHUNK);
        memListTrav = nxtNode;
    }
    sentry->next = NULL;
#endif
#endif

    unique->GCTime += util_cpu_time() - localTime;

    hook = unique->postGCHook;
    while (hook != NULL) {
        int res = (hook->f)(unique,"DD",NULL);
        if (res == 0) return(0);
        hook = hook->next;
    }

#ifdef DD_VERBOSE
    (void) fprintf(unique->err," done\n");
#endif

    return(totalDeleted+totalDeletedZ);

}